

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::writeAll(Assembler *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  type_info *ptVar7;
  Error *this_00;
  reference pvVar8;
  reference pvVar9;
  mapped_type *this_01;
  reference pvVar10;
  string local_108;
  int local_e4;
  undefined1 local_e0 [4];
  int j;
  int local_bc;
  undefined1 local_b8 [4];
  int i_3;
  string function_name;
  undefined1 local_90 [4];
  int i_2;
  int local_70;
  undefined1 local_6a;
  allocator<char> local_69;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  Assembler *pAStack_10;
  int i;
  Assembler *this_local;
  
  pAStack_10 = this;
  poVar3 = std::operator<<(this->_wtr,".constants:");
  std::operator<<(poVar3,'\n');
  local_14 = 0;
  do {
    uVar4 = (ulong)local_14;
    sVar5 = std::vector<std::any,_std::allocator<std::any>_>::size(&this->_consts);
    if (sVar5 <= uVar4) {
      poVar3 = std::operator<<(this->_wtr,".start:");
      std::operator<<(poVar3,'\n');
      local_70 = 0;
      while( true ) {
        uVar4 = (ulong)local_70;
        sVar5 = std::vector<Instruction,_std::allocator<Instruction>_>::size
                          (&this->_startInstructions);
        if (sVar5 <= uVar4) break;
        poVar3 = (ostream *)std::ostream::operator<<(this->_wtr,local_70);
        poVar3 = std::operator<<(poVar3,'\t');
        pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                           (&this->_startInstructions,(long)local_70);
        instructionToAssembly_abi_cxx11_((string *)local_90,this,pvVar8);
        poVar3 = std::operator<<(poVar3,(string *)local_90);
        std::operator<<(poVar3,'\n');
        std::__cxx11::string::~string((string *)local_90);
        local_70 = local_70 + 1;
      }
      poVar3 = std::operator<<(this->_wtr,".functions:");
      std::operator<<(poVar3,'\n');
      function_name.field_2._12_4_ = 0;
      while( true ) {
        uVar4 = (ulong)(int)function_name.field_2._12_4_;
        sVar5 = std::
                vector<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                ::size(&this->_instructions);
        if (sVar5 <= uVar4) break;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->_functionNameConstant,(long)(int)function_name.field_2._12_4_);
        pvVar6 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                           (&this->_consts,(long)*pvVar9);
        std::any_cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   pvVar6);
        poVar3 = (ostream *)std::ostream::operator<<(this->_wtr,function_name.field_2._12_4_);
        poVar3 = std::operator<<(poVar3,'\t');
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->_functionNameConstant,(long)(int)function_name.field_2._12_4_);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar9);
        poVar3 = std::operator<<(poVar3,'\t');
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->_functionParameter,(key_type *)local_b8);
        sVar5 = std::vector<char,_std::allocator<char>_>::size(this_01);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
        std::operator<<(poVar3,"\t1\n");
        std::__cxx11::string::~string((string *)local_b8);
        function_name.field_2._12_4_ = function_name.field_2._12_4_ + 1;
      }
      local_bc = 0;
      while( true ) {
        uVar4 = (ulong)local_bc;
        sVar5 = std::
                vector<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                ::size(&this->_instructions);
        if (sVar5 <= uVar4) break;
        poVar3 = std::operator<<(this->_wtr,".F");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_bc);
        poVar3 = std::operator<<(poVar3,":\t#");
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->_functionNameConstant,(long)local_bc);
        pvVar6 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                           (&this->_consts,(long)*pvVar9);
        std::any_cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   pvVar6);
        poVar3 = std::operator<<(poVar3,(string *)local_e0);
        std::operator<<(poVar3,'\n');
        std::__cxx11::string::~string((string *)local_e0);
        local_e4 = 0;
        while( true ) {
          uVar4 = (ulong)local_e4;
          pvVar10 = std::
                    vector<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                    ::operator[](&this->_instructions,(long)local_bc);
          sVar5 = std::vector<Instruction,_std::allocator<Instruction>_>::size(pvVar10);
          if (sVar5 <= uVar4) break;
          poVar3 = (ostream *)std::ostream::operator<<(this->_wtr,local_e4);
          poVar3 = std::operator<<(poVar3,'\t');
          pvVar10 = std::
                    vector<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                    ::operator[](&this->_instructions,(long)local_bc);
          pvVar8 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                             (pvVar10,(long)local_e4);
          instructionToAssembly_abi_cxx11_(&local_108,this,pvVar8);
          poVar3 = std::operator<<(poVar3,(string *)&local_108);
          std::operator<<(poVar3,'\n');
          std::__cxx11::string::~string((string *)&local_108);
          local_e4 = local_e4 + 1;
        }
        local_bc = local_bc + 1;
      }
      return;
    }
    pvVar6 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                       (&this->_consts,(long)local_14);
    ptVar7 = std::any::type(pvVar6);
    bVar1 = std::type_info::operator==(ptVar7,(type_info *)&int::typeinfo);
    if (bVar1) {
      poVar3 = (ostream *)std::ostream::operator<<(this->_wtr,local_14);
      poVar3 = std::operator<<(poVar3,"\tI\t");
      pvVar6 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                         (&this->_consts,(long)local_14);
      iVar2 = std::any_cast<int>(pvVar6);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3,'\n');
    }
    else {
      pvVar6 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                         (&this->_consts,(long)local_14);
      ptVar7 = std::any::type(pvVar6);
      bVar1 = std::type_info::operator==(ptVar7,(type_info *)&std::__cxx11::string::typeinfo);
      if (!bVar1) {
        local_6a = 1;
        this_00 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i_1,"Unvalid typeid",&local_69);
        Error::Error(this_00,(string *)&i_1);
        local_6a = 0;
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      poVar3 = (ostream *)std::ostream::operator<<(this->_wtr,local_14);
      poVar3 = std::operator<<(poVar3,"\tS\t\"");
      pvVar6 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                         (&this->_consts,(long)local_14);
      std::any_cast<std::__cxx11::string>(&local_38,pvVar6);
      poVar3 = std::operator<<(poVar3,(string *)&local_38);
      std::operator<<(poVar3,"\"\n");
      std::__cxx11::string::~string((string *)&local_38);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void Assembler::writeAll() {
	//const
	_wtr << ".constants:" << '\n';
	for (int i = 0; i < _consts.size(); i++) {
		if (_consts[i].type() == typeid(int)) {
			_wtr << i << "\tI\t" << std::any_cast<int>(_consts[i]) << '\n';
		}
		else if (_consts[i].type() == typeid(std::string)) {
			_wtr << i << "\tS\t\"" << std::any_cast<std::string>(_consts[i]) << "\"\n";
		}
		else {
			throw Error("Unvalid typeid");
		}
	}
	//start code
	_wtr << ".start:" << '\n';
	for (int i = 0; i < _startInstructions.size(); i++) {
		_wtr << i << '\t' << instructionToAssembly(_startInstructions[i]) << '\n';
	}
	//function table
	_wtr << ".functions:" << '\n';
	for (int i = 0; i < _instructions.size(); i++) {
		std::string function_name = std::any_cast<std::string>(_consts[_functionNameConstant[i]]);
		_wtr << i << '\t' << _functionNameConstant[i] << '\t' << _functionParameter[function_name].size() << "\t1\n";
	}
	//function instructions table
	for (int i = 0; i < _instructions.size(); i++) {
		_wtr << ".F" << i << ":\t#" << std::any_cast<std::string>(_consts[_functionNameConstant[i]]) << '\n';
		for (int j = 0; j < _instructions[i].size(); j++) {
			_wtr << j << '\t' << instructionToAssembly(_instructions[i][j]) << '\n';
		}
	}
}